

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore>::loadComms
          (CommsBroker<helics::tcp::TcpCommsSS,_helics::CommonCore> *this)

{
  unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>
  *in_stack_ffffffffffffff58;
  unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>
  *in_stack_ffffffffffffff60;
  function<void_(helics::ActionMessage_&&)> *in_stack_ffffffffffffff68;
  BrokerBase *this_00;
  CommsInterface *this_01;
  undefined1 local_68 [104];
  
  this_01 = (CommsInterface *)(local_68 + 0x58);
  std::make_unique<helics::tcp::TcpCommsSS>();
  std::unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>::operator=
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>::
  ~unique_ptr(in_stack_ffffffffffffff60);
  CLI::std::unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>::
  operator->((unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_> *)
             0x424e9d);
  std::function<void(helics::ActionMessage&&)>::
  function<helics::CommsBroker<helics::tcp::TcpCommsSS,helics::CommonCore>::loadComms()::_lambda(helics::ActionMessage&&)_1_,void>
            ((function<void_(helics::ActionMessage_&&)> *)this_01,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffff68);
  CommsInterface::setCallback(this_01,in_stack_ffffffffffffff68);
  std::function<void_(helics::ActionMessage_&&)>::~function
            ((function<void_(helics::ActionMessage_&&)> *)0x424ede);
  CLI::std::unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_>::
  operator->((unique_ptr<helics::tcp::TcpCommsSS,_std::default_delete<helics::tcp::TcpCommsSS>_> *)
             0x424eef);
  this_00 = (BrokerBase *)local_68;
  BrokerBase::getLoggingCallback(this_00);
  CommsInterface::setLoggingCallback
            (this_01,(function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)this_00);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *)0x424f27);
  return;
}

Assistant:

void CommsBroker<COMMS, BrokerT>::loadComms()
{
    comms = std::make_unique<COMMS>();
    comms->setCallback([this](ActionMessage&& M) { BrokerBase::addActionMessage(std::move(M)); });
    comms->setLoggingCallback(BrokerBase::getLoggingCallback());
}